

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_quotes(string *str)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  iterator this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc8;
  __const_iterator in_stack_fffffffffffffff0;
  __const_iterator __first;
  
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (in_RDI);
  __first._M_current = (char *)in_RDI;
  if ((1 < sVar2) &&
     (((pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
       *pvVar3 == '\"' ||
       (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
       *pvVar3 == '\'')) ||
      (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
      __first._M_current = (char *)in_RDI, *pvVar3 == '`')))) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = (int)*pvVar3;
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(iVar1,in_stack_ffffffffffffffc0));
    __first._M_current = (char *)in_RDI;
    if (iVar1 == *pvVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      __first._M_current = (char *)in_RDI;
      this = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       (in_RDI);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin(in_RDI)
      ;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator+(in_stack_ffffffffffffffc8,CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 this._M_current,__first,in_stack_fffffffffffffff0);
    }
  }
  return (string *)__first._M_current;
}

Assistant:

CLI11_INLINE std::string &remove_quotes(std::string &str) {
    if(str.length() > 1 && (str.front() == '"' || str.front() == '\'' || str.front() == '`')) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}